

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

Test * anon_unknown.dwarf_e24fa::StatTestSimple::Create(void)

{
  StatTest *this;
  
  this = (StatTest *)operator_new(0x1a8);
  StatTest::StatTest(this);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__StatTest_001d4e68;
  (this->super_DiskInterface).super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__StatTestSimple_001d4ec8;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(StatTest, Simple) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL);
  ASSERT_EQ(2u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_EQ("in",  stats_[1]);
}